

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O2

xmlIntFunc * xmlUnicodeLookup(xmlUnicodeNameTable *tptr,char *tname)

{
  xmlUnicodeRange *pxVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if (tname != (char *)0x0 && tptr != (xmlUnicodeNameTable *)0x0) {
    iVar5 = tptr->numentries + -1;
    pxVar1 = tptr->table;
    iVar4 = 0;
    while (iVar4 <= iVar5) {
      uVar3 = (uint)(iVar5 + iVar4) >> 1;
      iVar2 = strcmp(tname,pxVar1[uVar3].rangename);
      if (iVar2 == 0) {
        return pxVar1[uVar3].func;
      }
      if (iVar2 < 0) {
        iVar5 = uVar3 - 1;
      }
      else {
        iVar4 = uVar3 + 1;
      }
    }
  }
  return (xmlIntFunc *)0x0;
}

Assistant:

static xmlIntFunc
*xmlUnicodeLookup(const xmlUnicodeNameTable *tptr, const char *tname) {
    int low, high, mid, cmp;
    const xmlUnicodeRange *sptr;

    if ((tptr == NULL) || (tname == NULL)) return(NULL);

    low = 0;
    high = tptr->numentries - 1;
    sptr = tptr->table;
    while (low <= high) {
	mid = (low + high) / 2;
	if ((cmp=strcmp(tname, sptr[mid].rangename)) == 0)
	    return (sptr[mid].func);
	if (cmp < 0)
	    high = mid - 1;
	else
	    low = mid + 1;
    }
    return (NULL);
}